

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

BCReg const_num(FuncState *fs,ExpDesc *e)

{
  TValue *pTVar1;
  TValue TVar2;
  TValue *o;
  lua_State *L;
  ExpDesc *e_local;
  FuncState *fs_local;
  
  pTVar1 = lj_tab_set(fs->L,fs->kt,(cTValue *)e);
  if ((pTVar1->field_4).it == 0) {
    fs_local._4_4_ = (pTVar1->u32).lo;
  }
  else {
    TVar2.field_4.it = 0;
    TVar2.field_4.i = fs->nkn;
    *pTVar1 = TVar2;
    fs_local._4_4_ = fs->nkn;
    fs->nkn = fs_local._4_4_ + 1;
  }
  return fs_local._4_4_;
}

Assistant:

static BCReg const_num(FuncState *fs, ExpDesc *e)
{
  lua_State *L = fs->L;
  TValue *o;
  lj_assertFS(expr_isnumk(e), "bad usage");
  o = lj_tab_set(L, fs->kt, &e->u.nval);
  if (tvhaskslot(o))
    return tvkslot(o);
  o->u64 = fs->nkn;
  return fs->nkn++;
}